

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.h
# Opt level: O0

void __thiscall xemmai::portable::t_library::t_library(t_library *this,wstring *a_path)

{
  char *pcVar1;
  void *pvVar2;
  wchar_t *in_RCX;
  wstring_view a_string;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  __sv_type local_48;
  string local_38;
  wstring *local_18;
  wstring *a_path_local;
  t_library *this_local;
  
  local_18 = a_path;
  a_path_local = (wstring *)this;
  std::operator+(&local_68,a_path,L".so");
  local_48 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_68);
  a_string._M_str = in_RCX;
  a_string._M_len = (size_t)local_48._M_str;
  f_convert_abi_cxx11_(&local_38,(portable *)local_48._M_len,a_string);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_38);
  pvVar2 = (void *)dlopen(pcVar1,0x101);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  this->v_handle = pvVar2;
  return;
}

Assistant:

t_library(const std::wstring& a_path) : v_handle(dlopen(f_convert(a_path + L".so").c_str(), RTLD_LAZY | RTLD_GLOBAL))
	{
//		if (v_handle == NULL) std::fprintf(stderr, "dlopen: %s\n", dlerror());
	}